

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one.hpp
# Opt level: O0

bool tao::pegtl::internal::
     one<(tao::pegtl::internal::result_on_found)1,tao::pegtl::internal::peek_char,(char)63>::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  bool bVar1;
  pair_t pVar2;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  pair_t t;
  undefined6 in_stack_ffffffffffffffe8;
  input_pair in_stack_ffffffffffffffee;
  input_pair iVar3;
  undefined1 in_stack_ffffffffffffffef;
  uint8_t uVar4;
  
  bVar1 = memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_RDI);
  if (!bVar1) {
    pVar2 = peek_char::
            peek<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
                      ((string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffef,
                                   CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)),
                       0x1cfdf9);
    iVar3 = (input_pair)pVar2.data;
    uVar4 = pVar2.size;
    bVar1 = input_pair::operator_cast_to_bool((input_pair *)&stack0xffffffffffffffee);
    if ((bVar1) && (iVar3 == (input_pair)0x3f)) {
      bump_help<(tao::pegtl::internal::result_on_found)1,_tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,____>
                (in_RDI,CONCAT17(uVar4,CONCAT16(0x3f,in_stack_ffffffffffffffe8)));
      return true;
    }
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.empty() ) )
            {
               if( !in.empty() ) {
                  if( const auto t = Peek::peek( in ) ) {
                     if( ( t.data == C ) == bool( R ) ) {
                        bump_help< R, Input, typename Peek::data_t, C >( in, t.size );
                        return true;
                     }
                  }
               }
               return false;
            }